

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

int XMLNode_get_attribute_with_default
              (XMLNode *node,SXML_CHAR *attr_name,SXML_CHAR **attr_value,
              SXML_CHAR *default_attr_value)

{
  uint uVar1;
  char *pcVar2;
  
  if (attr_name == (SXML_CHAR *)0x0 || node == (XMLNode *)0x0) {
    return 0;
  }
  if (attr_value == (SXML_CHAR **)0x0) {
    return 0;
  }
  if (*attr_name == '\0') {
    return 0;
  }
  if (node->init_value != 0x19770522) {
    return 0;
  }
  uVar1 = XMLNode_search_attribute(node,attr_name,0);
  if ((int)uVar1 < 0) {
    if (default_attr_value != (SXML_CHAR *)0x0) goto LAB_00102d16;
  }
  else {
    default_attr_value = node->attributes[uVar1].value;
    if (default_attr_value != (SXML_CHAR *)0x0) {
LAB_00102d16:
      pcVar2 = strdup(default_attr_value);
      *attr_value = pcVar2;
      if (pcVar2 != (char *)0x0) {
        return 1;
      }
      return 0;
    }
  }
  *attr_value = (SXML_CHAR *)0x0;
  return 1;
}

Assistant:

int XMLNode_get_attribute_with_default(XMLNode* node, const SXML_CHAR* attr_name, const SXML_CHAR** attr_value, const SXML_CHAR* default_attr_value)
{
	XMLAttribute* pt;
	int i;
	
	if (node == NULL || attr_name == NULL || attr_name[0] == NULC || attr_value == NULL || node->init_value != XML_INIT_DONE)
		return FALSE;
	
	i = XMLNode_search_attribute(node, attr_name, 0);
	if (i >= 0) {
		pt = node->attributes;
		if (pt[i].value != NULL) {
			*attr_value = sx_strdup(pt[i].value);
			if (*attr_value == NULL)
				return FALSE;
		} else
			*attr_value = NULL; /* NULL but returns 'true' as 'NULL' is the actual attribute value */
	} else if (default_attr_value != NULL) {
		*attr_value = sx_strdup(default_attr_value);
		if (*attr_value == NULL)
			return FALSE;
	} else
		*attr_value = NULL;

	return TRUE;
}